

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

void Abc_TtImplementNpnConfig(word *pTruth,int nVars,char *pCanonPerm,uint uCanonPhase)

{
  char cVar1;
  word wVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  word *pwVar7;
  uint uVar8;
  word *pLimit;
  int iVar9;
  ulong uVar10;
  word *pwVar11;
  ulong uVar12;
  
  uVar3 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar3 = 1;
  }
  if (0 < (int)uVar3 && (uCanonPhase >> (nVars & 0x1fU) & 1) != 0) {
    uVar5 = 0;
    do {
      pTruth[uVar5] = ~pTruth[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  uVar5 = (ulong)(uint)nVars;
  if (0 < nVars) {
    uVar6 = 0;
    do {
      if ((uCanonPhase >> ((uint)uVar6 & 0x1f) & 1) != 0) {
        bVar4 = (byte)(1 << ((byte)uVar6 & 0x1f));
        if (uVar3 == 1) {
          *pTruth = (s_Truths6[uVar6] & *pTruth) >> (bVar4 & 0x3f) |
                    *pTruth << (bVar4 & 0x3f) & s_Truths6[uVar6];
        }
        else if (uVar6 < 6) {
          if (0 < (int)uVar3) {
            uVar12 = s_Truths6[uVar6];
            uVar10 = 0;
            do {
              pTruth[uVar10] =
                   (pTruth[uVar10] & uVar12) >> (bVar4 & 0x3f) |
                   pTruth[uVar10] << (bVar4 & 0x3f) & uVar12;
              uVar10 = uVar10 + 1;
            } while (uVar3 != uVar10);
          }
        }
        else if (0 < (int)uVar3) {
          bVar4 = (byte)(uVar6 - 6);
          uVar8 = 1 << (bVar4 & 0x1f);
          iVar9 = 2 << (bVar4 & 0x1f);
          uVar12 = 1;
          if (1 < (int)uVar8) {
            uVar12 = (ulong)uVar8;
          }
          pwVar11 = pTruth + (int)uVar8;
          pwVar7 = pTruth;
          do {
            if (uVar6 - 6 != 0x1f) {
              uVar10 = 0;
              do {
                wVar2 = pwVar7[uVar10];
                pwVar7[uVar10] = pwVar11[uVar10];
                pwVar11[uVar10] = wVar2;
                uVar10 = uVar10 + 1;
              } while (uVar12 != uVar10);
            }
            pwVar7 = pwVar7 + iVar9;
            pwVar11 = pwVar11 + iVar9;
          } while (pwVar7 < pTruth + (int)uVar3);
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  if (0 < nVars && pCanonPerm != (char *)0x0) {
    uVar12 = 0;
    uVar6 = uVar12;
    do {
      while (uVar6 != (uint)(int)pCanonPerm[uVar12]) {
        uVar12 = uVar12 + 1;
        if (uVar5 == uVar12) {
          __assert_fail("k < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                        ,0x690,"void Abc_TtImplementNpnConfig(word *, int, char *, unsigned int)");
        }
      }
      if (uVar6 != (uVar12 & 0xffffffff)) {
        Abc_TtSwapVars(pTruth,nVars,(int)uVar6,(int)uVar12);
        cVar1 = pCanonPerm[uVar6];
        pCanonPerm[uVar6] = pCanonPerm[uVar12];
        pCanonPerm[uVar12] = cVar1;
      }
      uVar12 = uVar6 + 1;
      uVar6 = uVar12;
    } while (uVar12 != uVar5);
  }
  return;
}

Assistant:

static inline void Abc_TtImplementNpnConfig( word * pTruth, int nVars, char * pCanonPerm, unsigned uCanonPhase )
{
    int i, k, nWords = Abc_TtWordNum( nVars );
    if ( (uCanonPhase >> nVars) & 1 )
        Abc_TtNot( pTruth, nWords );
    for ( i = 0; i < nVars; i++ )
        if ( (uCanonPhase >> i) & 1 )
            Abc_TtFlip( pTruth, nWords, i );
    if ( pCanonPerm )
    for ( i = 0; i < nVars; i++ )
    {
        for ( k = i; k < nVars; k++ )
            if ( pCanonPerm[k] == i )
                break;
        assert( k < nVars );
        if ( i == k )
            continue;
        Abc_TtSwapVars( pTruth, nVars, i, k );
        ABC_SWAP( int, pCanonPerm[i], pCanonPerm[k] );
    }
}